

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_TrimmedExponential_Test::TestBody(Sampling_TrimmedExponential_Test *this)

{
  Float max;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float *pfVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  Allocator AVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  uint64_t oldstate;
  undefined1 *puVar16;
  char *pcVar17;
  char *in_R9;
  undefined1 auVar18 [16];
  float fVar19;
  Float FVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float c;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  PiecewiseConstant1D distrib;
  AssertHelper local_198;
  uint local_18c;
  long *local_188;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  undefined1 local_178 [16];
  float local_15c;
  undefined1 local_158 [16];
  string local_148;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  undefined1 *local_e0;
  long local_d8;
  AssertHelper local_d0;
  uint local_c8;
  Float aFStack_c4 [9];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a0;
  PiecewiseConstant1D local_80;
  
  lVar15 = 0;
  aFStack_c4[7] = 0.0;
  aFStack_c4[1] = 0.0;
  aFStack_c4[4] = 0.0;
  local_e0 = &DAT_5851f42d4c957f2e;
  _local_c8 = 0x400000003f800000;
  aFStack_c4[2] = 5.0;
  aFStack_c4[3] = 10.0;
  aFStack_c4[5] = 0.25;
  aFStack_c4[6] = 20.0;
  do {
    local_18c = *(uint *)((long)&local_c8 + lVar15);
    max = *(Float *)((long)aFStack_c4 + lVar15);
    local_100._M_unused._M_object = &local_18c;
    local_100._8_8_ = 0;
    local_e8 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:848:20)>
               ::_M_invoke;
    local_f0 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:848:20)>
               ::_M_manager;
    AVar12.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_a0,(function<float_(float)> *)&local_100,0x8000,0x10,0.0,max,AVar12);
    local_d8 = lVar15;
    if (local_f0 != (code *)0x0) {
      (*local_f0)(&local_100,&local_100,__destroy_functor);
    }
    sVar9 = local_a0.nStored;
    pfVar8 = local_a0.ptr;
    AVar12.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar9;
    f.ptr = pfVar8;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&local_80,f,0.0,max,AVar12);
    iVar14 = 100;
    puVar16 = local_e0;
    do {
      uVar11 = (uint)((ulong)puVar16 >> 0x2d) ^ (uint)((ulong)puVar16 >> 0x1b);
      bVar13 = (byte)((ulong)puVar16 >> 0x3b);
      auVar6._8_8_ = in_XMM6_Qb;
      auVar6._0_8_ = in_XMM6_Qa;
      auVar18 = vcvtusi2ss_avx512f(auVar6,uVar11 >> bVar13 | uVar11 << 0x20 - bVar13);
      auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      local_128._0_4_ = auVar18._0_4_;
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      local_178 = vxorps_avx512vl(ZEXT416(local_18c),auVar18);
      fVar19 = expf(local_178._0_4_ * max);
      auVar18 = vfnmadd132ss_fma(ZEXT416((uint)(1.0 - fVar19)),SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416((uint)local_128._0_4_));
      fVar19 = logf(auVar18._0_4_);
      fVar19 = fVar19 / (float)local_178._0_4_;
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_158._4_12_;
      local_158 = auVar7 << 0x20;
      local_178._0_4_ = fVar19;
      if ((0.0 <= fVar19) && (fVar19 <= max)) {
        local_158 = ZEXT416(local_18c);
        auVar1._8_4_ = 0x80000000;
        auVar1._0_8_ = 0x8000000080000000;
        auVar1._12_4_ = 0x80000000;
        local_118 = vxorps_avx512vl(local_158,auVar1);
        fVar19 = expf(local_118._0_4_ * max);
        local_158._0_4_ = (float)local_158._0_4_ / (1.0 - fVar19);
        fVar19 = expf((float)local_118._0_4_ * (float)local_178._0_4_);
        local_158._0_4_ = fVar19 * (float)local_158._0_4_;
      }
      FVar20 = pbrt::PiecewiseConstant1D::Sample
                         (&local_80,(Float)local_128._0_4_,&local_15c,(int *)0x0);
      local_118._0_4_ = FVar20;
      local_188 = (long *)&DAT_3f847ae147ae147b;
      auVar2._8_4_ = 0x7fffffff;
      auVar2._0_8_ = 0x7fffffff7fffffff;
      auVar2._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(ZEXT416((uint)((float)local_178._0_4_ - FVar20)),auVar2);
      local_198.data_._0_4_ = auVar18._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_148,"std::abs(cx - dx)","1e-2",(float *)&local_198,
                 (double *)&local_188);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_188 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)(float)local_178._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_188 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)(float)local_118._0_4_);
        pcVar17 = "";
        if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
          pcVar17 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x35a,pcVar17);
        testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        if (local_188 != (long *)0x0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (local_188 != (long *)0x0)) {
            (**(code **)(*local_188 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_188 = (long *)&DAT_3f847ae147ae147b;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(ZEXT416((uint)((float)local_158._0_4_ - local_15c)),auVar3);
      local_198.data_._0_4_ = auVar18._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_148,"std::abs(cp - dp)","1e-2",(float *)&local_198,
                 (double *)&local_188);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_188 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)(float)local_158._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_188 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_15c);
        pcVar17 = "";
        if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
          pcVar17 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x35c,pcVar17);
        testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        if (local_188 != (long *)0x0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (local_188 != (long *)0x0)) {
            (**(code **)(*local_188 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      local_118 = vxorps_avx512vl(ZEXT416(local_18c),auVar4);
      fVar19 = expf(local_118._0_4_ * (float)local_178._0_4_);
      local_158._0_4_ = 1.0 - fVar19;
      fVar19 = expf((float)local_118._0_4_ * max);
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      fVar21 = (float)local_158._0_4_ / (1.0 - fVar19);
      auVar18 = vandps_avx(ZEXT416((uint)fVar21),auVar22);
      auVar18 = vminss_avx(auVar18,ZEXT416((uint)local_128._0_4_));
      fVar19 = (float)local_128._0_4_ - fVar21;
      bVar10 = auVar18._0_4_ < 0.01;
      auVar18 = vandps_avx(ZEXT416((uint)bVar10 * (int)fVar19 +
                                   (uint)!bVar10 *
                                   (int)((fVar19 + fVar19) / ((float)local_128._0_4_ + fVar21))),
                           auVar22);
      local_188 = (long *)CONCAT71(local_188._1_7_,auVar18._0_4_ <= 0.01);
      local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar18._0_4_) {
        testing::Message::Message((Message *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) + 0x10),"u = ",
                   4);
        std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) + 0x10),
                   " -> x = ",8);
        std::ostream::_M_insert<double>((double)(float)local_178._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) + 0x10),
                   " -> ... ",8);
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        local_128 = vxorps_avx512vl(ZEXT416(local_18c),auVar5);
        fVar19 = expf(local_128._0_4_ * (float)local_178._0_4_);
        local_178._0_4_ = 1.0 - fVar19;
        fVar19 = expf((float)local_128._0_4_ * max);
        std::ostream::_M_insert<double>((double)((float)local_178._0_4_ / (1.0 - fVar19)));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)&local_188,
                   (AssertionResult *)"checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax))",
                   "true","false",in_R9);
        local_178._0_8_ = puVar16;
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x367,(char *)CONCAT71(local_148._M_dataplus._M_p._1_7_,
                                           (char)local_148._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_148._M_dataplus._M_p._1_7_,(char)local_148._M_dataplus._M_p) !=
            &local_148.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_148._M_dataplus._M_p._1_7_,(char)local_148._M_dataplus._M_p
                                  ),local_148.field_2._M_allocated_capacity + 1);
        }
        puVar16 = (undefined1 *)local_178._0_8_;
        if (CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) != 0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) &&
             ((long *)CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar16 = (undefined1 *)((long)puVar16 * 0x5851f42d4c957f2d + 1);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_80.cdf);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_80.func);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_a0);
    lVar15 = local_d8 + 0xc;
  } while (lVar15 != 0x24);
  return;
}

Assistant:

TEST(Sampling, TrimmedExponential) {
    Float params[][3] = {{1., 2.}, {5, 10}, {.25, 20}};
    for (const auto p : params) {
        Float c = p[0], xMax = p[1];
        auto exp = [&](Float x) { return std::exp(-c * x); };

        auto values = Sample1DFunction(exp, 32768, 16, 0, xMax);
        PiecewiseConstant1D distrib(values, 0, xMax);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedExponential(u, c, xMax);
            Float cp = TrimmedExponentialPDF(cx, c, xMax);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 1e-2)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 1e-2)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedExponentialSample(cx, c, xMax);
        }
    }
}